

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZKrylovEigenSolver.h
# Opt level: O2

void __thiscall TPZKrylovEigenSolver<float>::SetKrylovDim(TPZKrylovEigenSolver<float> *this,int k)

{
  ostream *poVar1;
  
  if (k < 2) {
    poVar1 = std::operator<<((ostream *)&std::cout,"Adjusted Krylov dim to ");
    k = 2;
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,2);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  this->fKrylovDim = k;
  return;
}

Assistant:

void TPZKrylovEigenSolver<TVar>::SetKrylovDim(int k)
{
  if(k<2){
    k = 2;
    std::cout<< "Adjusted Krylov dim to "<< k<<std::endl;
  }
  fKrylovDim = k;
}